

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesDispatch2<true,false>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  int *piVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  
  if (outSumSquaredDerivatives == (double *)0x0) {
    iVar3 = *(int *)(this + 0x14);
    if (0 < iVar3) {
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar4 = *(long *)(this + 0xf0);
      lVar5 = *(long *)(this + 0xf8);
      uVar14 = 0;
      auVar18 = vpbroadcastq_avx512f();
      do {
        auVar19 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar19,auVar17);
        uVar13 = vpcmpuq_avx512f(auVar19,auVar18,2);
        piVar1 = (int *)(lVar5 + uVar14 * 4);
        bVar6 = (byte)uVar13;
        auVar15._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * piVar1[1];
        auVar15._0_4_ = (uint)(bVar6 & 1) * *piVar1;
        auVar15._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * piVar1[2];
        auVar15._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * piVar1[3];
        auVar15._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * piVar1[4];
        auVar15._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * piVar1[5];
        auVar15._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * piVar1[6];
        auVar15._28_4_ = (uint)(byte)(uVar13 >> 7) * piVar1[7];
        piVar1 = (int *)(lVar4 + uVar14 * 4);
        auVar16._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * piVar1[1];
        auVar16._0_4_ = (uint)(bVar6 & 1) * *piVar1;
        auVar16._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * piVar1[2];
        auVar16._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * piVar1[3];
        auVar16._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * piVar1[4];
        auVar16._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * piVar1[5];
        auVar16._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * piVar1[6];
        auVar16._28_4_ = (uint)(byte)(uVar13 >> 7) * piVar1[7];
        auVar15 = vdivps_avx(auVar15,auVar16);
        auVar19 = vcvtps2pd_avx512f(auVar15);
        pdVar2 = outDerivatives + uVar14;
        bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar13 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar13 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar13 >> 6) & 1);
        *pdVar2 = (double)((ulong)(bVar6 & 1) * auVar19._0_8_ |
                          (ulong)!(bool)(bVar6 & 1) * (long)*pdVar2);
        pdVar2[1] = (double)((ulong)bVar7 * auVar19._8_8_ | (ulong)!bVar7 * (long)pdVar2[1]);
        pdVar2[2] = (double)((ulong)bVar8 * auVar19._16_8_ | (ulong)!bVar8 * (long)pdVar2[2]);
        pdVar2[3] = (double)((ulong)bVar9 * auVar19._24_8_ | (ulong)!bVar9 * (long)pdVar2[3]);
        pdVar2[4] = (double)((ulong)bVar10 * auVar19._32_8_ | (ulong)!bVar10 * (long)pdVar2[4]);
        pdVar2[5] = (double)((ulong)bVar11 * auVar19._40_8_ | (ulong)!bVar11 * (long)pdVar2[5]);
        pdVar2[6] = (double)((ulong)bVar12 * auVar19._48_8_ | (ulong)!bVar12 * (long)pdVar2[6]);
        pdVar2[7] = (double)((uVar13 >> 7) * auVar19._56_8_ |
                            (ulong)!SUB81(uVar13 >> 7,0) * (long)pdVar2[7]);
        uVar14 = uVar14 + 8;
      } while ((iVar3 + 7U & 0xfffffff8) != uVar14);
    }
    return;
  }
  accumulateDerivativesImpl<true,false,true>
            (this,outDerivatives,outSumDerivatives,outSumSquaredDerivatives);
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch2(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumSquaredDerivatives == NULL) {
        accumulateDerivativesImpl<DoDerivatives, DoSum, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesImpl<DoDerivatives, DoSum, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}